

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::ScanScalarEnd(void)

{
  int iVar1;
  RegEx *in_stack_ffffffffffffffc0;
  RegEx *in_stack_ffffffffffffffc8;
  
  if (ScanScalarEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ScanScalarEnd()::e);
    if (iVar1 != 0) {
      EndScalar();
      BlankOrBreak();
      Comment();
      YAML::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      operator|(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      RegEx::~RegEx((RegEx *)0xf22915);
      RegEx::~RegEx((RegEx *)0xf2291f);
      __cxa_atexit(RegEx::~RegEx,&ScanScalarEnd::e,&__dso_handle);
      __cxa_guard_release(&ScanScalarEnd()::e);
    }
  }
  return &ScanScalarEnd::e;
}

Assistant:

inline const RegEx& ScanScalarEnd() {
  static const RegEx e = EndScalar() | (BlankOrBreak() + Comment());
  return e;
}